

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_sign.c
# Opt level: O1

int crypto_sign_keypair(uchar *pk,uchar *sk)

{
  uint uVar1;
  picnic_privatekey_t psk;
  picnic_publickey_t ppk;
  undefined1 local_ba [97];
  undefined1 local_59 [65];
  
  uVar1 = picnic_keygen(7,local_59,local_ba);
  if (uVar1 == 0) {
    uVar1 = picnic_write_public_key(local_59,pk,0x23);
    if ((int)uVar1 < 0) {
      picnic_clear_private_key(local_ba);
    }
    else {
      uVar1 = picnic_write_private_key(local_ba,sk,0x34);
      picnic_clear_private_key(local_ba);
      uVar1 = (int)uVar1 >> 0x1f & uVar1;
    }
  }
  return uVar1;
}

Assistant:

int crypto_sign_keypair(unsigned char* pk, unsigned char* sk) {
  picnic_publickey_t ppk;
  picnic_privatekey_t psk;

  int ret = picnic_keygen(Picnic3_L1, &ppk, &psk);
  if (ret) {
    return ret;
  }

  ret = picnic_write_public_key(&ppk, pk, PICNIC_PUBLIC_KEY_SIZE(Picnic3_L1));
  if (ret < 0) {
    picnic_clear_private_key(&psk);
    return ret;
  }

  ret = picnic_write_private_key(&psk, sk, PICNIC_PRIVATE_KEY_SIZE(Picnic3_L1));
  picnic_clear_private_key(&psk);
  if (ret < 0) {
    return ret;
  }

  return 0;
}